

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

vector<CAddress,_std::allocator<CAddress>_> * __thiscall
CConnman::GetAddresses
          (vector<CAddress,_std::allocator<CAddress>_> *__return_storage_ptr__,CConnman *this,
          CNode *requestor,size_t max_addresses,size_t max_pct)

{
  uint16_t uVar1;
  Network NVar2;
  CSipHasher *pCVar3;
  time_point tVar4;
  _Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_> _Var5;
  uint64_t uVar6;
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CConnman::CachedAddrResponse>_>,_bool>
  pVar7;
  uint64_t cache_id;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_socket_bytes;
  uint64_t local_118;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  undefined1 local_f8 [8];
  pointer pCStack_f0;
  pointer local_e8;
  microseconds mStack_e0;
  CSipHasher local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::GetAddrBytes(&local_110,(CNetAddr *)&requestor->addrBind);
  CSipHasher::CSipHasher((CSipHasher *)local_f8,this->nSeed0,this->nSeed1);
  pCVar3 = CSipHasher::Write((CSipHasher *)local_f8,0x1cf2e4ddd306dda9);
  local_68.v[0] = pCVar3->v[0];
  local_68.v[1] = pCVar3->v[1];
  local_68.v[2] = pCVar3->v[2];
  local_68.v[3] = pCVar3->v[3];
  local_68.tmp = pCVar3->tmp;
  local_68.count = pCVar3->count;
  local_68._41_7_ = *(undefined7 *)&pCVar3->field_0x29;
  NVar2 = NET_ONION;
  if (requestor->m_inbound_onion == false) {
    NVar2 = CNetAddr::GetNetClass((CNetAddr *)&requestor->addr);
  }
  pCVar3 = CSipHasher::Write(&local_68,(ulong)NVar2);
  data.m_size = (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  data.m_data = local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  pCVar3 = CSipHasher::Write(pCVar3,data);
  if (requestor->m_conn_type == INBOUND) {
    uVar1 = CService::GetPort(&(requestor->addrBind).super_CService);
    uVar6 = (uint64_t)uVar1;
  }
  else {
    uVar6 = 0;
  }
  pCVar3 = CSipHasher::Write(pCVar3,uVar6);
  local_118 = CSipHasher::Finalize(pCVar3);
  tVar4 = NodeClock::now();
  local_e8 = (pointer)0x0;
  mStack_e0.__r = 0;
  local_f8 = (undefined1  [8])0x0;
  pCStack_f0 = (pointer)0x0;
  pVar7 = std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,CConnman::CachedAddrResponse>,std::_Select1st<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>>
          ::_M_emplace_unique<unsigned_long&,CConnman::CachedAddrResponse>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,CConnman::CachedAddrResponse>,std::_Select1st<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,CConnman::CachedAddrResponse>>>
                      *)&this->m_addr_response_caches,&local_118,(CachedAddrResponse *)local_f8);
  _Var5 = pVar7.first._M_node;
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_f8);
  if (*(long *)(_Var5._M_node + 2) < (long)tVar4.__d.__r / 1000) {
    GetAddresses((vector<CAddress,_std::allocator<CAddress>_> *)&local_68,this,max_addresses,max_pct
                 ,(optional<Network>)0x0,true);
    local_f8 = (undefined1  [8])_Var5._M_node[1]._M_parent;
    pCStack_f0 = (pointer)_Var5._M_node[1]._M_left;
    local_e8 = (pointer)_Var5._M_node[1]._M_right;
    _Var5._M_node[1]._M_parent = (_Base_ptr)local_68.v[0];
    _Var5._M_node[1]._M_left = (_Base_ptr)local_68.v[1];
    _Var5._M_node[1]._M_right = (_Base_ptr)local_68.v[2];
    local_68.v[0] = 0;
    local_68.v[1] = 0;
    local_68.v[2] = 0;
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)local_f8);
    std::vector<CAddress,_std::allocator<CAddress>_>::~vector
              ((vector<CAddress,_std::allocator<CAddress>_> *)&local_68);
    FastRandomContext::FastRandomContext((FastRandomContext *)local_f8,false);
    do {
      uVar6 = RandomMixin<FastRandomContext>::randbits
                        ((RandomMixin<FastRandomContext> *)local_f8,0x23);
    } while (0xa0eeba < uVar6 >> 0xb);
    *(uint64_t *)(_Var5._M_node + 2) = (long)tVar4.__d.__r / 1000 + uVar6 + 75600000000;
    ChaCha20::~ChaCha20((ChaCha20 *)&local_e8);
  }
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            (__return_storage_ptr__,
             (vector<CAddress,_std::allocator<CAddress>_> *)&_Var5._M_node[1]._M_parent);
  if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<CAddress> CConnman::GetAddresses(CNode& requestor, size_t max_addresses, size_t max_pct)
{
    auto local_socket_bytes = requestor.addrBind.GetAddrBytes();
    uint64_t cache_id = GetDeterministicRandomizer(RANDOMIZER_ID_ADDRCACHE)
        .Write(requestor.ConnectedThroughNetwork())
        .Write(local_socket_bytes)
        // For outbound connections, the port of the bound address is randomly
        // assigned by the OS and would therefore not be useful for seeding.
        .Write(requestor.IsInboundConn() ? requestor.addrBind.GetPort() : 0)
        .Finalize();
    const auto current_time = GetTime<std::chrono::microseconds>();
    auto r = m_addr_response_caches.emplace(cache_id, CachedAddrResponse{});
    CachedAddrResponse& cache_entry = r.first->second;
    if (cache_entry.m_cache_entry_expiration < current_time) { // If emplace() added new one it has expiration 0.
        cache_entry.m_addrs_response_cache = GetAddresses(max_addresses, max_pct, /*network=*/std::nullopt);
        // Choosing a proper cache lifetime is a trade-off between the privacy leak minimization
        // and the usefulness of ADDR responses to honest users.
        //
        // Longer cache lifetime makes it more difficult for an attacker to scrape
        // enough AddrMan data to maliciously infer something useful.
        // By the time an attacker scraped enough AddrMan records, most of
        // the records should be old enough to not leak topology info by
        // e.g. analyzing real-time changes in timestamps.
        //
        // It takes only several hundred requests to scrape everything from an AddrMan containing 100,000 nodes,
        // so ~24 hours of cache lifetime indeed makes the data less inferable by the time
        // most of it could be scraped (considering that timestamps are updated via
        // ADDR self-announcements and when nodes communicate).
        // We also should be robust to those attacks which may not require scraping *full* victim's AddrMan
        // (because even several timestamps of the same handful of nodes may leak privacy).
        //
        // On the other hand, longer cache lifetime makes ADDR responses
        // outdated and less useful for an honest requestor, e.g. if most nodes
        // in the ADDR response are no longer active.
        //
        // However, the churn in the network is known to be rather low. Since we consider
        // nodes to be "terrible" (see IsTerrible()) if the timestamps are older than 30 days,
        // max. 24 hours of "penalty" due to cache shouldn't make any meaningful difference
        // in terms of the freshness of the response.
        cache_entry.m_cache_entry_expiration = current_time +
            21h + FastRandomContext().randrange<std::chrono::microseconds>(6h);
    }
    return cache_entry.m_addrs_response_cache;
}